

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionOrDistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionOrDistSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistConstraintListSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,DistConstraintListSyntax *args_1)

{
  ExpressionOrDistSyntax *pEVar1;
  size_t in_RDX;
  DistConstraintListSyntax *in_RSI;
  BumpAllocator *in_RDI;
  ExpressionOrDistSyntax *unaff_retaddr;
  
  pEVar1 = (ExpressionOrDistSyntax *)allocate(in_RDI,(size_t)in_RSI,in_RDX);
  slang::syntax::ExpressionOrDistSyntax::ExpressionOrDistSyntax
            (unaff_retaddr,(ExpressionSyntax *)in_RDI,in_RSI);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }